

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

TypeMap * __thiscall
wasm::GlobalTypeRewriter::rebuildTypes
          (TypeMap *__return_storage_ptr__,GlobalTypeRewriter *this,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes)

{
  __node_base_ptr *this_00;
  HeapType continuation;
  Type TVar1;
  Type TVar2;
  type *__a;
  bool bVar3;
  HeapTypeKind HVar4;
  size_t sVar5;
  size_type sVar6;
  undefined4 extraout_var;
  _Storage<wasm::HeapType,_true> end;
  reference pvVar7;
  iterator this_01;
  iterator begin;
  iterator __first;
  iterator __last;
  reference pHVar8;
  uint *puVar9;
  Struct *other;
  undefined4 extraout_var_00;
  HeapType *pHVar10;
  Fatal *pFVar11;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_02;
  reference ppVar12;
  type *__k;
  type *ptVar13;
  const_reference pvVar14;
  mapped_type *pmVar15;
  GlobalTypeRewriter *__eql;
  Entry EVar16;
  Signature SVar17;
  optional<wasm::HeapType> other_00;
  optional<wasm::HeapType> other_01;
  anon_class_16_2_849a5f34_for_cmp cmp;
  type *index;
  type *type_3;
  undefined8 uStack_640;
  _Self local_630;
  iterator __end1_3;
  iterator __begin1_3;
  InsertOrderedMap<wasm::HeapType,_unsigned_int> *__range1_3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *newTypes;
  Error *local_480;
  Error *err;
  BuildResult buildResults;
  undefined1 local_448 [12];
  Entry local_438;
  uintptr_t local_428;
  HeapType local_420;
  undefined1 local_418 [12];
  Entry local_408;
  undefined8 local_3f8;
  _Storage<wasm::HeapType,_true> local_3f0;
  optional<wasm::HeapType> super_1;
  Entry local_3c0;
  HeapType local_3b0;
  HeapType local_3a8;
  Continuation newCont;
  Array local_390;
  undefined8 local_380;
  Entry local_378;
  uintptr_t local_368;
  undefined1 local_360 [8];
  Array newArray;
  Entry local_338;
  HeapType local_328;
  undefined1 local_320 [8];
  Struct newStruct;
  Entry local_2e0;
  HeapType local_2d0;
  Type TStack_2c8;
  Signature newSig;
  Entry local_2a8;
  type *local_298;
  type *_;
  type *type_2;
  undefined8 uStack_280;
  _Self local_270;
  iterator __end1_2;
  iterator __begin1_2;
  InsertOrderedMap<wasm::HeapType,_unsigned_int> *__range1_2;
  anon_class_8_1_8991fb9c map;
  HeapType local_248;
  HeapType type_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range1_1;
  Index i;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_1f0;
  pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *local_1d8;
  pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *local_1d0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_1c8;
  undefined1 local_1b0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> sorted;
  _Self local_190;
  iterator it;
  _Storage<wasm::HeapType,_true> local_180;
  optional<wasm::HeapType> super;
  pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> local_148;
  type *local_118;
  type *info;
  type *type;
  _Self local_100;
  iterator __end1;
  iterator __begin1;
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *__range1;
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  privateSupertypes;
  allocator<wasm::HeapType> local_bb;
  undefined1 local_ba [2];
  __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_b8;
  __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_b0;
  undefined1 local_a8 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  additionalSet;
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> typeInfo;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes_local;
  GlobalTypeRewriter *this_local;
  TypeMap *oldToNewTypes;
  
  wasm::ModuleUtils::collectHeapTypeInfo
            ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)
             &additionalSet._M_h._M_single_bucket,this->wasm,UsedIRTypes,FindVisibility);
  local_b0._M_current =
       (HeapType *)
       std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(additionalPrivateTypes);
  local_b8._M_current =
       (HeapType *)
       std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(additionalPrivateTypes);
  std::allocator<wasm::HeapType>::allocator(&local_bb);
  end = (_Storage<wasm::HeapType,_true>)0x0;
  __eql = (GlobalTypeRewriter *)local_ba;
  std::
  unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>
  ::
  unordered_set<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>
              *)local_a8,local_b0,local_b8,0,(hasher *)(local_ba + 1),(key_equal *)__eql,&local_bb);
  std::allocator<wasm::HeapType>::~allocator(&local_bb);
  std::
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ::vector((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
            *)&__range1);
  sVar5 = InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::size
                    ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)
                     &additionalSet._M_h._M_single_bucket);
  std::
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ::reserve((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
             *)&__range1,sVar5);
  this_00 = &additionalSet._M_h._M_single_bucket;
  __end1 = InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::begin
                     ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)this_00);
  local_100._M_node =
       (_List_node_base *)
       InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::end
                 ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)this_00);
  do {
    bVar3 = std::operator!=(&__end1,&local_100);
    if (!bVar3) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1b0);
      bVar3 = std::
              unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
              ::empty(&this->wasm->typeIndices);
      if (bVar3) {
        local_1d0 = (pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)
                    std::
                    vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                    ::begin((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                             *)&__range1);
        local_1d8 = (pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)
                    std::
                    vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                    ::end((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                           *)&__range1);
        TopologicalSort::
        sortOf<__gnu_cxx::__normal_iterator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>*,std::vector<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>,std::allocator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>>>>
                  (&local_1c8,(TopologicalSort *)local_1d0,
                   (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                    )local_1d8,
                   (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                    )end._M_value.id);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1b0,&local_1c8);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_1c8);
      }
      else {
        this_01 = std::
                  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                  ::begin((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                           *)&__range1);
        begin = std::
                vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                ::end((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                       *)&__range1);
        cmp.this = __eql;
        cmp.privateSupertypes =
             (vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
              *)this;
        TopologicalSort::
        minSortOf<__gnu_cxx::__normal_iterator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>*,std::vector<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>,std::allocator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>>>,wasm::GlobalTypeRewriter::rebuildTypes(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::__0>
                  (&local_1f0,(TopologicalSort *)this_01._M_current,
                   (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                    )begin._M_current,
                   (pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)&__range1,cmp);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1b0,&local_1f0);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_1f0);
      }
      __first = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1b0);
      __last = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1b0);
      std::
      reverse<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                ((__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                  )__first._M_current,
                 (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                  )__last._M_current);
      __range1_1._4_4_ = 0;
      __end1_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1b0);
      type_1.id = (uintptr_t)
                  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1b0);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                 *)&type_1), bVar3) {
        pHVar8 = __gnu_cxx::
                 __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                 ::operator*(&__end1_1);
        local_248.id = pHVar8->id;
        puVar9 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::operator[]
                           (&this->typeIndices,&local_248);
        *puVar9 = __range1_1._4_4_;
        __gnu_cxx::
        __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
        ::operator++(&__end1_1);
        __range1_1._4_4_ = __range1_1._4_4_ + 1;
      }
      sVar5 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::size(&this->typeIndices);
      if (sVar5 == 0) {
        memset(__return_storage_ptr__,0,0x38);
        std::
        unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
        ::unordered_map(__return_storage_ptr__);
        map.this._4_4_ = 1;
      }
      else {
        sVar5 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::size(&this->typeIndices);
        TypeBuilder::grow(&this->typeBuilder,sVar5);
        sVar5 = TypeBuilder::size(&this->typeBuilder);
        TypeBuilder::createRecGroup(&this->typeBuilder,0,sVar5);
        __range1_1._4_4_ = 0;
        __range1_2 = (InsertOrderedMap<wasm::HeapType,_unsigned_int> *)this;
        __end1_2 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::begin(&this->typeIndices);
        local_270._M_node =
             (_List_node_base *)
             InsertOrderedMap<wasm::HeapType,_unsigned_int>::end(&this->typeIndices);
        while( true ) {
          bVar3 = std::operator!=(&__end1_2,&local_270);
          if (!bVar3) break;
          ppVar12 = std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator*
                              (&__end1_2);
          type_2 = (type *)(ppVar12->first).id;
          uStack_280._0_4_ = ppVar12->second;
          uStack_280._4_4_ = *(undefined4 *)&ppVar12->field_0xc;
          _ = (type *)std::get<0ul,wasm::HeapType_const,unsigned_int>
                                ((pair<const_wasm::HeapType,_unsigned_int> *)&type_2);
          local_298 = std::get<1ul,wasm::HeapType_const,unsigned_int>
                                ((pair<const_wasm::HeapType,_unsigned_int> *)&type_2);
          EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
          newSig.results.id = (uintptr_t)__range1_2;
          local_2a8 = EVar16;
          TypeBuilder::Entry::
          copy<wasm::GlobalTypeRewriter::rebuildTypes(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::__1>
                    (&local_2a8,(HeapType)*(uintptr_t *)_,(anon_class_8_1_8991fb9c)__range1_2);
          HVar4 = HeapType::getKind((HeapType *)_);
          switch(HVar4) {
          case Basic:
            handle_unreachable("unexpected kind",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                               ,0xa0);
          case Func:
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            local_2e0 = EVar16;
            local_2d0 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_2e0);
            SVar17 = HeapType::getSignature(&local_2d0);
            newSig.params = SVar17.results.id;
            TStack_2c8 = SVar17.params.id;
            (*this->_vptr_GlobalTypeRewriter[5])(this,*(undefined8 *)_,&TStack_2c8);
            TVar2.id = newSig.params.id;
            TVar1.id = TStack_2c8.id;
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            newStruct.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)EVar16.builder;
            SVar17.results.id = TVar2.id;
            SVar17.params.id = TVar1.id;
            TypeBuilder::Entry::operator=
                      ((Entry *)&newStruct.fields.
                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,SVar17);
            break;
          case Struct:
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            local_338 = EVar16;
            local_328 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_338);
            other = HeapType::getStruct(&local_328);
            Struct::Struct((Struct *)local_320,other);
            (*this->_vptr_GlobalTypeRewriter[2])(this,*(undefined8 *)_,local_320);
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            newArray.element._8_8_ = EVar16.builder;
            TypeBuilder::Entry::operator=((Entry *)&newArray.element.packedType,(Struct *)local_320)
            ;
            map.this._4_4_ = 8;
            Struct::~Struct((Struct *)local_320);
            break;
          case Array:
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            local_378 = EVar16;
            local_368 = (uintptr_t)TypeBuilder::Entry::operator_cast_to_HeapType(&local_378);
            HeapType::getArray((HeapType *)local_360);
            local_380 = *(undefined8 *)_;
            (*this->_vptr_GlobalTypeRewriter[3])(this,local_380,local_360);
            Array::Array(&local_390,(Array *)local_360);
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            newCont.type.id = (HeapType)EVar16.builder;
            TypeBuilder::Entry::operator=((Entry *)&newCont,&local_390);
            break;
          case Cont:
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            local_3c0 = EVar16;
            local_3b0 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_3c0);
            local_3a8.id = (uintptr_t)HeapType::getContinuation(&local_3b0);
            (*this->_vptr_GlobalTypeRewriter[4])(this,*(undefined8 *)_,&local_3a8);
            continuation.id = local_3a8.id;
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = EVar16.builder;
            TypeBuilder::Entry::operator=
                      ((Entry *)&super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload
                                 .super__Optional_payload_base<wasm::HeapType>._M_engaged,
                       (Continuation)continuation.id);
          }
          local_3f8 = *(undefined8 *)_;
          local_3f0._0_4_ = (*this->_vptr_GlobalTypeRewriter[7])(this,local_3f8);
          local_3f0._M_value.id._4_4_ = extraout_var_00;
          bVar3 = std::optional::operator_cast_to_bool((optional *)&local_3f0._M_value);
          if (bVar3) {
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            local_408 = EVar16;
            pHVar10 = std::optional<wasm::HeapType>::operator*
                                ((optional<wasm::HeapType> *)&local_3f0._M_value);
            local_428 = pHVar10->id;
            local_420 = rebuildTypes::anon_class_8_1_8991fb9c::operator()
                                  ((anon_class_8_1_8991fb9c *)&__range1_2,local_428);
            std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
                      ((optional<wasm::HeapType> *)local_418,&local_420);
            other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
            other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload =
                 (_Storage<wasm::HeapType,_true>)local_418._0_8_;
            other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_418[8];
            other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._9_3_ = local_418._9_3_;
            TypeBuilder::Entry::subTypeOf(&local_408,other_00);
          }
          else {
            EVar16 = TypeBuilder::operator[](&this->typeBuilder,(ulong)__range1_1._4_4_);
            local_438 = EVar16;
            std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_448);
            other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
            other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload =
                 (_Storage<wasm::HeapType,_true>)local_448._0_8_;
            other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_448[8];
            other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._9_3_ = local_448._9_3_;
            TypeBuilder::Entry::subTypeOf(&local_438,other_01);
          }
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
               = *(undefined8 *)_;
          (*this->_vptr_GlobalTypeRewriter[6])
                    (this,&this->typeBuilder,(ulong)__range1_1._4_4_,
                     buildResults.
                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .
                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     ._24_8_);
          __range1_1._4_4_ = __range1_1._4_4_ + 1;
          std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator++(&__end1_2)
          ;
        }
        TypeBuilder::build((BuildResult *)&err,&this->typeBuilder);
        local_480 = TypeBuilder::BuildResult::getError((BuildResult *)&err);
        if (local_480 != (Error *)0x0) {
          Fatal::Fatal((Fatal *)&newTypes);
          pFVar11 = Fatal::operator<<((Fatal *)&newTypes,
                                      (char (*) [42])"Internal GlobalTypeRewriter build error: ");
          pFVar11 = Fatal::operator<<(pFVar11,&local_480->reason);
          pFVar11 = Fatal::operator<<(pFVar11,(char (*) [11])0x294b9d1);
          Fatal::operator<<(pFVar11,&local_480->index);
          Fatal::~Fatal((Fatal *)&newTypes);
        }
        this_02 = TypeBuilder::BuildResult::operator*((BuildResult *)&err);
        std::
        unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
        ::unordered_map(__return_storage_ptr__);
        __end1_3 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::begin(&this->typeIndices);
        local_630._M_node =
             (_List_node_base *)
             InsertOrderedMap<wasm::HeapType,_unsigned_int>::end(&this->typeIndices);
        while( true ) {
          bVar3 = std::operator!=(&__end1_3,&local_630);
          if (!bVar3) break;
          ppVar12 = std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator*
                              (&__end1_3);
          type_3 = (type *)(ppVar12->first).id;
          uStack_640._0_4_ = ppVar12->second;
          uStack_640._4_4_ = *(undefined4 *)&ppVar12->field_0xc;
          __k = std::get<0ul,wasm::HeapType_const,unsigned_int>
                          ((pair<const_wasm::HeapType,_unsigned_int> *)&type_3);
          ptVar13 = std::get<1ul,wasm::HeapType_const,unsigned_int>
                              ((pair<const_wasm::HeapType,_unsigned_int> *)&type_3);
          pvVar14 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                              (this_02,(ulong)*ptVar13);
          pmVar15 = std::
                    unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                    ::operator[](__return_storage_ptr__,__k);
          pmVar15->id = pvVar14->id;
          std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator++(&__end1_3)
          ;
        }
        mapTypeNamesAndIndices(this,__return_storage_ptr__);
        map.this._4_4_ = 1;
        TypeBuilder::BuildResult::~BuildResult((BuildResult *)&err);
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1b0);
      std::
      vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
      ::~vector((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                 *)&__range1);
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        *)local_a8);
      InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::~InsertOrderedMap
                ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)
                 &additionalSet._M_h._M_single_bucket);
      return __return_storage_ptr__;
    }
    type = &std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>::
            operator*(&__end1)->first;
    info = (type *)std::get<0ul,wasm::HeapType_const,wasm::ModuleUtils::HeapTypeInfo>
                             ((pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)type);
    local_118 = std::get<1ul,wasm::HeapType_const,wasm::ModuleUtils::HeapTypeInfo>
                          ((pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)type);
    if ((local_118->visibility == Private) ||
       (sVar6 = std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::count((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                         *)local_a8,(key_type *)info), sVar6 != 0)) {
      __a = info;
      SmallVector<wasm::HeapType,_1UL>::SmallVector
                ((SmallVector<wasm::HeapType,_1UL> *)
                 &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_engaged);
      std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>::
      pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>,_true>
                (&local_148,(HeapType *)__a,
                 (SmallVector<wasm::HeapType,_1UL> *)
                 &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_engaged);
      std::
      vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
      ::push_back((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                   *)&__range1,&local_148);
      std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>::~pair(&local_148);
      SmallVector<wasm::HeapType,_1UL>::~SmallVector
                ((SmallVector<wasm::HeapType,_1UL> *)
                 &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_engaged);
      it._M_node = *(_List_node_base **)info;
      end._0_4_ = (*this->_vptr_GlobalTypeRewriter[7])(this,it._M_node);
      end._M_value.id._4_4_ = extraout_var;
      local_180 = end;
      bVar3 = std::optional::operator_cast_to_bool((optional *)&local_180._M_value);
      if (bVar3) {
        pHVar10 = std::optional<wasm::HeapType>::operator*
                            ((optional<wasm::HeapType> *)&local_180._M_value);
        local_190._M_node =
             (_List_node_base *)
             InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::find
                       ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)
                        &additionalSet._M_h._M_single_bucket,pHVar10);
        sorted.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::end
                                ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>
                                  *)&additionalSet._M_h._M_single_bucket);
        bVar3 = std::operator!=(&local_190,
                                (_Self *)&sorted.
                                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar3) {
          end = (_Storage<wasm::HeapType,_true>)
                std::
                _List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>::
                operator->(&local_190);
          bVar3 = true;
          if (*(Visibility *)((long)end + 0xc) != Private) goto LAB_01981e1f;
        }
        else {
LAB_01981e1f:
          pHVar10 = std::optional<wasm::HeapType>::operator*
                              ((optional<wasm::HeapType> *)&local_180._M_value);
          sVar6 = std::
                  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                  ::count((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                           *)local_a8,pHVar10);
          bVar3 = sVar6 != 0;
        }
        if (bVar3) {
          pvVar7 = std::
                   vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                   ::back((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                           *)&__range1);
          pHVar10 = std::optional<wasm::HeapType>::operator*
                              ((optional<wasm::HeapType> *)&local_180._M_value);
          SmallVector<wasm::HeapType,_1UL>::push_back(&pvVar7->second,pHVar10);
        }
      }
    }
    std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

GlobalTypeRewriter::TypeMap GlobalTypeRewriter::rebuildTypes(
  const std::vector<HeapType>& additionalPrivateTypes) {
  // Find the heap types that are not publicly observable. Even in a closed
  // world scenario, don't modify public types because we assume that they may
  // be reflected on or used for linking. Figure out where each private type
  // will be located in the builder.
  auto typeInfo = ModuleUtils::collectHeapTypeInfo(
    wasm,
    ModuleUtils::TypeInclusion::UsedIRTypes,
    ModuleUtils::VisibilityHandling::FindVisibility);

  std::unordered_set<HeapType> additionalSet(additionalPrivateTypes.begin(),
                                             additionalPrivateTypes.end());

  std::vector<std::pair<HeapType, SmallVector<HeapType, 1>>> privateSupertypes;
  privateSupertypes.reserve(typeInfo.size());
  for (auto& [type, info] : typeInfo) {
    if (info.visibility != ModuleUtils::Visibility::Private &&
        !additionalSet.count(type)) {
      continue;
    }
    privateSupertypes.push_back({type, {}});

    if (auto super = getDeclaredSuperType(type)) {
      auto it = typeInfo.find(*super);
      // Record the supertype only if it is among the private types.
      if ((it != typeInfo.end() &&
           it->second.visibility == ModuleUtils::Visibility::Private) ||
          additionalSet.count(*super)) {
        privateSupertypes.back().second.push_back(*super);
      }
    }
  }

  // Topological sort to have subtypes first. This is the opposite of the
  // order we need, so the comparison is the opposite of what we ultimately
  // want.
  std::vector<HeapType> sorted;
  if (wasm.typeIndices.empty()) {
    sorted = TopologicalSort::sortOf(privateSupertypes.begin(),
                                     privateSupertypes.end());
  } else {
    sorted =
      TopologicalSort::minSortOf(privateSupertypes.begin(),
                                 privateSupertypes.end(),
                                 [&](Index a, Index b) {
                                   auto typeA = privateSupertypes[a].first;
                                   auto typeB = privateSupertypes[b].first;
                                   // Preserve type order.
                                   auto itA = wasm.typeIndices.find(typeA);
                                   auto itB = wasm.typeIndices.find(typeB);
                                   bool hasA = itA != wasm.typeIndices.end();
                                   bool hasB = itB != wasm.typeIndices.end();
                                   if (hasA != hasB) {
                                     // Types with preserved indices must be
                                     // sorted before (after in this reversed
                                     // comparison) types without indices to
                                     // maintain transitivity.
                                     return !hasA;
                                   }
                                   if (hasA && *itA != *itB) {
                                     return !(itA->second < itB->second);
                                   }
                                   // Break ties by the arbitrary order we
                                   // have collected the types in.
                                   return a > b;
                                 });
  }
  std::reverse(sorted.begin(), sorted.end());
  Index i = 0;
  for (auto type : sorted) {
    typeIndices[type] = i++;
  }

  if (typeIndices.size() == 0) {
    return {};
  }

  typeBuilder.grow(typeIndices.size());

  // All the input types are distinct, so we need to make sure the output types
  // are distinct as well. Further, the new types may have more recursions than
  // the original types, so the old recursion groups may not be sufficient any
  // more. Both of these problems are solved by putting all the new types into a
  // single large recursion group.
  typeBuilder.createRecGroup(0, typeBuilder.size());

  // Create the temporary heap types.
  i = 0;
  auto map = [&](HeapType type) -> HeapType {
    if (auto it = typeIndices.find(type); it != typeIndices.end()) {
      return typeBuilder[it->second];
    }
    return type;
  };
  for (auto [type, _] : typeIndices) {
    typeBuilder[i].copy(type, map);
    switch (type.getKind()) {
      case HeapTypeKind::Func: {
        auto newSig = HeapType(typeBuilder[i]).getSignature();
        modifySignature(type, newSig);
        typeBuilder[i] = newSig;
        break;
      }
      case HeapTypeKind::Struct: {
        auto newStruct = HeapType(typeBuilder[i]).getStruct();
        modifyStruct(type, newStruct);
        typeBuilder[i] = newStruct;
        break;
      }
      case HeapTypeKind::Array: {
        auto newArray = HeapType(typeBuilder[i]).getArray();
        modifyArray(type, newArray);
        typeBuilder[i] = newArray;
        break;
      }
      case HeapTypeKind::Cont: {
        auto newCont = HeapType(typeBuilder[i]).getContinuation();
        modifyContinuation(type, newCont);
        typeBuilder[i] = newCont;
        break;
      }
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }

    if (auto super = getDeclaredSuperType(type)) {
      typeBuilder[i].subTypeOf(map(*super));
    } else {
      typeBuilder[i].subTypeOf(std::nullopt);
    }

    modifyTypeBuilderEntry(typeBuilder, i, type);
    ++i;
  }

  auto buildResults = typeBuilder.build();
#ifndef NDEBUG
  if (auto* err = buildResults.getError()) {
    Fatal() << "Internal GlobalTypeRewriter build error: " << err->reason
            << " at index " << err->index;
  }
#endif
  auto& newTypes = *buildResults;

  // TODO: It is possible that the newly built rec group matches some public rec
  // group. If that is the case, we need to try a different permutation of the
  // types or add a brand type to distinguish the private types.

  // Map the old types to the new ones.
  TypeMap oldToNewTypes;
  for (auto [type, index] : typeIndices) {
    oldToNewTypes[type] = newTypes[index];
  }
  mapTypeNamesAndIndices(oldToNewTypes);
  return oldToNewTypes;
}